

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall
libtorrent::piece_picker::get_downloaders
          (piece_picker *this,
          vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *d,
          piece_index_t index)

{
  ushort uVar1;
  pointer pptVar2;
  download_queue_t queue;
  iterator dp;
  block_info *__x;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  span<libtorrent::piece_picker::block_info> sVar6;
  torrent_peer *local_30;
  
  pptVar2 = (d->
            super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((d->
      super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != pptVar2) {
    (d->super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pptVar2;
  }
  queue = piece_pos::download_queue
                    ((this->m_piece_map).
                     super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                     .
                     super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                     ._M_impl.super__Vector_impl_data._M_start + index.m_val);
  uVar1 = (&this->m_blocks_per_piece)
          [index.m_val + 1 ==
           (int)((ulong)((long)(this->m_piece_map).
                               super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                               .
                               super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_piece_map).
                              super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              .
                              super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)];
  uVar4 = (ulong)uVar1;
  std::vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::reserve
            (d,uVar4);
  if (queue.m_val == '\x04') {
    while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
      local_30 = (torrent_peer *)0x0;
      std::vector<libtorrent::torrent_peer*,std::allocator<libtorrent::torrent_peer*>>::
      emplace_back<libtorrent::torrent_peer*>
                ((vector<libtorrent::torrent_peer*,std::allocator<libtorrent::torrent_peer*>> *)d,
                 &local_30);
    }
  }
  else {
    dp = find_dl_piece(this,queue,index);
    sVar6 = mutable_blocks_for_piece(this,dp._M_current);
    __x = sVar6.m_ptr;
    uVar4 = (ulong)uVar1;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      std::vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::
      push_back(d,&__x->peer);
      __x = __x + 1;
    }
  }
  return;
}

Assistant:

void piece_picker::get_downloaders(std::vector<torrent_peer*>& d
		, piece_index_t const index) const
	{
		d.clear();
		auto const state = m_piece_map[index].download_queue();
		int const num_blocks = blocks_in_piece(index);
		d.reserve(aux::numeric_cast<std::size_t>(num_blocks));

		if (state == piece_pos::piece_open)
		{
			for (int i = 0; i < num_blocks; ++i) d.push_back(nullptr);
			return;
		}

		auto const i = find_dl_piece(state, index);
		TORRENT_ASSERT(i != m_downloads[state].end());
		auto const binfo = blocks_for_piece(*i);
		for (int j = 0; j != num_blocks; ++j)
		{
			TORRENT_ASSERT(binfo[j].peer == nullptr
				|| binfo[j].peer->in_use);
			d.push_back(binfo[j].peer);
		}
	}